

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_valddi.cpp
# Opt level: O3

ze_result_t
validation_layer::zeMemAllocHost
          (ze_context_handle_t hContext,ze_host_mem_alloc_desc_t *host_desc,size_t size,
          size_t alignment,void **pptr)

{
  code *pcVar1;
  long lVar2;
  long *plVar3;
  ze_result_t result;
  ze_result_t zVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long *local_68 [2];
  long local_58 [2];
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  
  lVar2 = context;
  lVar5 = *(long *)(context + 0xd50);
  local_68[0] = local_58;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_68,"zeMemAllocHost(hContext, host_desc, size, alignment, pptr)","");
  if (*(char *)(lVar5 + 1) == '\x01') {
    local_48 = 0;
    uStack_40 = 0;
    local_38 = 0;
    spdlog::logger::log(*(logger **)(lVar5 + 8),0.0);
  }
  if (local_68[0] != local_58) {
    operator_delete(local_68[0],local_58[0] + 1);
  }
  pcVar1 = *(code **)(lVar2 + 0x3c8);
  if (pcVar1 == (code *)0x0) {
    result = ZE_RESULT_ERROR_UNSUPPORTED_FEATURE;
  }
  else {
    lVar5 = *(long *)(lVar2 + 0xd30);
    lVar2 = *(long *)(lVar2 + 0xd38);
    lVar6 = lVar2 - lVar5 >> 3;
    if (lVar2 != lVar5) {
      lVar7 = 0;
      do {
        plVar3 = (long *)**(undefined8 **)(*(long *)(context + 0xd30) + lVar7 * 8);
        result = (**(code **)(*plVar3 + 0x5c0))(plVar3,hContext,host_desc,size,alignment,pptr);
        if (result != ZE_RESULT_SUCCESS) goto LAB_001555cd;
        lVar7 = lVar7 + 1;
      } while (lVar6 + (ulong)(lVar6 == 0) != lVar7);
    }
    lVar7 = context;
    if (((*(char *)(context + 4) != '\x01') ||
        (result = ZEHandleLifetimeValidation::zeMemAllocHostPrologue
                            (*(ZEHandleLifetimeValidation **)(context + 0xd48),hContext,host_desc,
                             size,alignment,pptr), result == ZE_RESULT_SUCCESS)) &&
       (zVar4 = (*pcVar1)(hContext,host_desc,size,alignment,pptr), result = zVar4, lVar2 != lVar5))
    {
      lVar5 = 0;
      do {
        plVar3 = (long *)**(undefined8 **)(*(long *)(lVar7 + 0xd30) + lVar5 * 8);
        result = (**(code **)(*plVar3 + 0x5c8))(plVar3,hContext,host_desc,size,alignment,pptr,zVar4)
        ;
        if (result != ZE_RESULT_SUCCESS) break;
        lVar5 = lVar5 + 1;
        result = zVar4;
      } while (lVar6 + (ulong)(lVar6 == 0) != lVar5);
    }
  }
LAB_001555cd:
  logAndPropagateResult("zeMemAllocHost",result);
  return result;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zeMemAllocHost(
        ze_context_handle_t hContext,                   ///< [in] handle of the context object
        const ze_host_mem_alloc_desc_t* host_desc,      ///< [in] pointer to host memory allocation descriptor
        size_t size,                                    ///< [in] size in bytes to allocate; must be less than or equal to the
                                                        ///< `maxMemAllocSize` member of ::ze_device_properties_t
        size_t alignment,                               ///< [in] minimum alignment in bytes for the allocation; must be a power of
                                                        ///< two
        void** pptr                                     ///< [out] pointer to host allocation
        )
    {
        context.logger->log_trace("zeMemAllocHost(hContext, host_desc, size, alignment, pptr)");

        auto pfnAllocHost = context.zeDdiTable.Mem.pfnAllocHost;

        if( nullptr == pfnAllocHost )
            return logAndPropagateResult("zeMemAllocHost", ZE_RESULT_ERROR_UNSUPPORTED_FEATURE);

        auto numValHandlers = context.validationHandlers.size();
        for (size_t i = 0; i < numValHandlers; i++) {
            auto result = context.validationHandlers[i]->zeValidation->zeMemAllocHostPrologue( hContext, host_desc, size, alignment, pptr );
            if(result!=ZE_RESULT_SUCCESS) return logAndPropagateResult("zeMemAllocHost", result);
        }


        if( context.enableThreadingValidation ){ 
            //Unimplemented
        }

        
        if(context.enableHandleLifetime ){
            auto result = context.handleLifetime->zeHandleLifetime.zeMemAllocHostPrologue( hContext, host_desc, size, alignment, pptr );
            if(result!=ZE_RESULT_SUCCESS) return logAndPropagateResult("zeMemAllocHost", result);
        }

        auto driver_result = pfnAllocHost( hContext, host_desc, size, alignment, pptr );

        for (size_t i = 0; i < numValHandlers; i++) {
            auto result = context.validationHandlers[i]->zeValidation->zeMemAllocHostEpilogue( hContext, host_desc, size, alignment, pptr ,driver_result);
            if(result!=ZE_RESULT_SUCCESS) return logAndPropagateResult("zeMemAllocHost", result);
        }

        return logAndPropagateResult("zeMemAllocHost", driver_result);
    }